

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr.cpp
# Opt level: O0

void embree::storeEXR(Ref<embree::Image> *img,FileName *fileName)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this;
  long *in_RDI;
  int ret;
  char *err;
  Color4 c;
  size_t x;
  size_t y;
  vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_> rgb;
  char *in_stack_000002d0;
  int in_stack_000002d8;
  int in_stack_000002dc;
  int in_stack_000002e0;
  int in_stack_000002e4;
  float *in_stack_000002e8;
  char **in_stack_00000300;
  FileName *in_stack_fffffffffffffe18;
  FileName *this_00;
  uint in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  long *in_stack_fffffffffffffe68;
  string local_138 [32];
  string local_118 [36];
  int local_f4;
  char *local_f0;
  float local_e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_e0;
  float local_d0 [4];
  ulong local_c0;
  ulong local_b8;
  vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_> local_98;
  long *local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  float *local_30;
  char *local_28;
  char *local_20;
  float *local_18;
  float *local_10;
  reference local_8;
  
  local_78 = in_RDI;
  std::allocator<embree::Col3<float>_>::allocator((allocator<embree::Col3<float>_> *)0x451cc3);
  std::vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>::vector
            (in_stack_fffffffffffffe40,CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
             ,(allocator_type *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  std::allocator<embree::Col3<float>_>::~allocator((allocator<embree::Col3<float>_> *)0x451cec);
  local_b8 = 0;
  while( true ) {
    local_48 = local_78;
    if (*(ulong *)(*local_78 + 0x18) <= local_b8) break;
    local_c0 = 0;
    while( true ) {
      local_50 = local_78;
      if (*(ulong *)(*local_78 + 0x10) <= local_c0) break;
      local_58 = local_78;
      in_stack_fffffffffffffe68 = (long *)*local_78;
      (**(code **)(*in_stack_fffffffffffffe68 + 0x20))
                (local_e0._M_local_buf + 8,in_stack_fffffffffffffe68,local_c0,local_b8);
      local_20 = local_e0._M_local_buf + 8;
      local_28 = local_e0._M_local_buf + 0xc;
      local_30 = local_d0;
      local_18 = &local_e4;
      local_e4 = (float)local_e0._8_4_;
      local_e0._M_allocated_capacity._0_4_ = local_e0._12_4_;
      local_e0._M_allocated_capacity._4_4_ = local_d0[0];
      local_60 = local_78;
      in_stack_fffffffffffffe60 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_78;
      local_8 = std::vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>::operator[]
                          (&local_98,
                           local_b8 * (in_stack_fffffffffffffe60->field_2)._M_allocated_capacity +
                           local_c0);
      local_10 = &local_e4;
      local_8->r = local_e4;
      local_8->g = (float)local_e0._M_allocated_capacity._0_4_;
      local_8->b = (float)local_e0._M_allocated_capacity._4_4_;
      local_c0 = local_c0 + 1;
    }
    local_b8 = local_b8 + 1;
  }
  local_f0 = (char *)0x0;
  std::vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>::data
            ((vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_> *)0x451f83);
  local_68 = local_78;
  local_70 = local_78;
  FileName::str_abi_cxx11_(in_stack_fffffffffffffe18);
  std::__cxx11::string::c_str();
  this_00 = (FileName *)&local_f0;
  iVar1 = SaveEXR(in_stack_000002e8,in_stack_000002e4,in_stack_000002e0,in_stack_000002dc,
                  in_stack_000002d8,in_stack_000002d0,in_stack_00000300);
  std::__cxx11::string::~string(local_118);
  local_f4 = iVar1;
  if (iVar1 != 0) {
    if (local_f0 != (char *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"ERR: ");
      std::operator<<(poVar2,local_f0);
      FreeEXRErrorMessage((char *)0x4520a2);
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    FileName::str_abi_cxx11_(this_00);
    std::operator+((char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::runtime_error::runtime_error(this,local_138);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_>::~vector
            ((vector<embree::Col3<float>,_std::allocator<embree::Col3<float>_>_> *)
             (ulong)in_stack_fffffffffffffe30);
  return;
}

Assistant:

void storeEXR(const Ref<Image>& img, const FileName& fileName)
  {
    std::vector<Col3f> rgb(img->width * img->height);
    for (size_t y=0; y<img->height; ++y) {
        for (size_t x=0; x<img->width; ++x) {
            Color4 c = img->get(x, y);
            rgb[y * img->width + x] = Col3f(c.r, c.g, c.b);
        }
    }
    const char* err = NULL;
    int ret = SaveEXR((float*)rgb.data(), img->width, img->height, 3, 0, fileName.str().c_str(), &err);
    if (ret != TINYEXR_SUCCESS) {
      if (err) {
        std::cerr << "ERR: " << err;
        FreeEXRErrorMessage(err);
      }
      THROW_RUNTIME_ERROR("Could not save image " + fileName.str())
    }
  }